

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

bool __thiscall
Rml::HandleEdgeMarginParser::Parse
          (HandleEdgeMarginParser *this,String *value,Array<NumericValue,_4> *out_constraints)

{
  bool bVar1;
  reference pvVar2;
  Property *this_00;
  NumericValue NVar3;
  reference pvVar4;
  NumericValue *local_c0;
  Property *p;
  NumericValue NStack_88;
  int i;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  NumericValue local_68 [2];
  undefined1 local_58 [8];
  PropertyDictionary properties;
  Array<NumericValue,_4> *out_constraints_local;
  String *value_local;
  HandleEdgeMarginParser *this_local;
  
  properties.properties._40_8_ = out_constraints;
  PropertyDictionary::PropertyDictionary((PropertyDictionary *)local_58);
  bVar1 = PropertySpecification::ParseShorthandDeclaration
                    (&this->specification,(PropertyDictionary *)local_58,this->id_constraint,value);
  if (bVar1) {
    memset(&stack0xffffffffffffff78,0,0x20);
    local_c0 = &stack0xffffffffffffff78;
    do {
      NumericValue::NumericValue(local_c0);
      local_c0 = local_c0 + 1;
    } while (local_c0 != local_68);
    *(NumericValue *)properties.properties._40_8_ = NStack_88;
    *(undefined8 *)(properties.properties._40_8_ + 8) = local_80;
    *(undefined8 *)(properties.properties._40_8_ + 0x10) = local_78;
    *(undefined8 *)(properties.properties._40_8_ + 0x18) = local_70;
    for (p._4_4_ = 0; p._4_4_ < 4; p._4_4_ = p._4_4_ + 1) {
      pvVar2 = ::std::array<Rml::PropertyId,_4UL>::operator[](&this->ids,(long)p._4_4_);
      this_00 = PropertyDictionary::GetProperty((PropertyDictionary *)local_58,*pvVar2);
      if (this_00 != (Property *)0x0) {
        NVar3 = Property::GetNumericValue(this_00);
        pvVar4 = ::std::array<Rml::NumericValue,_4UL>::operator[]
                           ((array<Rml::NumericValue,_4UL> *)properties.properties._40_8_,
                            (long)p._4_4_);
        pvVar4->number = NVar3.number;
        pvVar4->unit = NVar3.unit;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  local_68[0].number = 1.4013e-45;
  PropertyDictionary::~PropertyDictionary((PropertyDictionary *)local_58);
  return this_local._7_1_;
}

Assistant:

bool Parse(const String& value, Array<NumericValue, 4>& out_constraints)
	{
		PropertyDictionary properties;
		if (!specification.ParseShorthandDeclaration(properties, id_constraint, value))
			return false;

		out_constraints = {};
		for (int i = 0; i < 4; i++)
		{
			if (const Property* p = properties.GetProperty(ids[i]))
				out_constraints[i] = p->GetNumericValue();
		}
		return true;
	}